

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void adjust_exif_parameters(JOCTET *data,uint length,JDIMENSION new_width,JDIMENSION new_height)

{
  long lVar1;
  bool bVar2;
  JOCTET JVar4;
  JDIMENSION JVar3;
  JOCTET *pJVar5;
  uint uVar6;
  JOCTET *pJVar7;
  JOCTET *pJVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  byte *pbVar16;
  int iVar17;
  long lVar18;
  byte *pbVar19;
  
  if (0xb < length) {
    if (*data == 'M') {
      if (data[1] != 'M') {
        return;
      }
      bVar2 = false;
    }
    else {
      if (*data != 'I') {
        return;
      }
      bVar2 = true;
      if (data[1] != 'I') {
        return;
      }
    }
    if (bVar2) {
      if (data[3] != '\0') {
        return;
      }
      JVar4 = data[2];
    }
    else {
      if (data[2] != '\0') {
        return;
      }
      JVar4 = data[3];
    }
    if (JVar4 == '*') {
      if (bVar2) {
        if (data[7] != '\0') {
          return;
        }
        if (data[6] != '\0') {
          return;
        }
        lVar9 = 4;
        lVar11 = 5;
      }
      else {
        if (data[4] != '\0') {
          return;
        }
        if (data[5] != '\0') {
          return;
        }
        lVar9 = 7;
        lVar11 = 6;
      }
      uVar14 = (uint)data[lVar11] * 0x100 + (uint)data[lVar9];
      if (uVar14 <= length - 2) {
        uVar10 = (ulong)uVar14;
        pbVar19 = data + (ulong)uVar14 + 1;
        if (bVar2) {
          pbVar19 = data + uVar10;
        }
        pbVar16 = data + uVar10 + 1;
        if (!bVar2) {
          pbVar16 = data + uVar10;
        }
        if ((CONCAT11(*pbVar16,*pbVar19) != 0) && (uVar6 = length - 0xc, uVar14 + 2 <= uVar6)) {
          lVar18 = 0;
          while( true ) {
            pJVar8 = data + lVar18 + uVar10 + 2;
            pJVar5 = data + lVar18 + uVar10 + 2 + 1;
            if (!bVar2) {
              pJVar5 = pJVar8;
              pJVar8 = data + lVar18 + uVar10 + 2 + 1;
            }
            if (CONCAT11(*pJVar5,*pJVar8) == -0x7897) break;
            if ((uint)*pbVar16 * 0xc00 + (uint)*pbVar19 * 0xc + -0xc == (int)lVar18) {
              return;
            }
            lVar1 = lVar18 + uVar10 + 2;
            lVar18 = lVar18 + 0xc;
            if ((ulong)uVar6 < lVar1 + 0xcU) {
              return;
            }
          }
          uVar13 = (ulong)CONCAT11(data[lVar11],data[lVar9]);
          if (bVar2) {
            if (data[lVar18 + 0xd + uVar13] != '\0') {
              return;
            }
            if (data[lVar18 + 0xc + (ulong)uVar14] != '\0') {
              return;
            }
            iVar12 = 8;
            iVar15 = 9;
          }
          else {
            if (data[lVar18 + 10 + uVar13] != '\0') {
              return;
            }
            if (data[lVar18 + 0xb + uVar13] != '\0') {
              return;
            }
            iVar12 = 0xb;
            iVar15 = 10;
          }
          iVar17 = (int)lVar18 + (int)(uVar10 + 2);
          if ((uint)CONCAT11(data[(uint)(iVar15 + iVar17)],data[(uint)(iVar12 + iVar17)]) <=
              length - 2) {
            uVar10 = (ulong)(uint)CONCAT11(data[(uint)(iVar15 + iVar17)],
                                           data[(uint)(iVar12 + iVar17)]);
            pJVar8 = data + uVar10;
            pJVar5 = data + uVar10 + 1;
            if (!bVar2) {
              pJVar5 = pJVar8;
              pJVar8 = data + uVar10 + 1;
            }
            uVar14 = (uint)CONCAT11(*pJVar5,*pJVar8);
            if (1 < uVar14) {
              pJVar8 = data + uVar10 + 2;
              uVar10 = uVar10 + 2;
              do {
                if (uVar6 < uVar10) {
                  return;
                }
                pJVar7 = pJVar8 + 1;
                pJVar5 = pJVar8;
                if (!bVar2) {
                  pJVar7 = pJVar8;
                  pJVar5 = pJVar8 + 1;
                }
                if ((CONCAT11(*pJVar7,*pJVar5) & 0xfffe) == 0xa002) {
                  JVar3 = new_height;
                  if (CONCAT11(*pJVar7,*pJVar5) == 0xa002) {
                    JVar3 = new_width;
                  }
                  JVar4 = (JOCTET)(JVar3 >> 8);
                  if (bVar2) {
                    pJVar8[2] = '\x04';
                    pJVar8[3] = '\0';
                    pJVar8[4] = '\x01';
                    pJVar8[5] = '\0';
                    pJVar8[6] = '\0';
                    pJVar8[7] = '\0';
                    pJVar8[8] = (JOCTET)JVar3;
                    pJVar8[9] = JVar4;
                    pJVar8[10] = '\0';
                    JVar3 = 0;
                  }
                  else {
                    pJVar8[2] = '\0';
                    pJVar8[3] = '\x04';
                    pJVar8[4] = '\0';
                    pJVar8[5] = '\0';
                    pJVar8[6] = '\0';
                    pJVar8[7] = '\x01';
                    pJVar8[8] = '\0';
                    pJVar8[9] = '\0';
                    pJVar8[10] = JVar4;
                  }
                  pJVar8[0xb] = (JOCTET)JVar3;
                }
                uVar10 = uVar10 + 0xc;
                pJVar8 = pJVar8 + 0xc;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
              return;
            }
          }
        }
      }
      return;
    }
  }
  return;
}

Assistant:

LOCAL(void)
adjust_exif_parameters(JOCTET *data, unsigned int length, JDIMENSION new_width,
                       JDIMENSION new_height)
{
  boolean is_motorola; /* Flag for byte order */
  unsigned int number_of_tags, tagnum;
  unsigned int firstoffset, offset;
  JDIMENSION new_value;

  if (length < 12) return; /* Length of an IFD entry */

  /* Discover byte order */
  if (data[0] == 0x49 && data[1] == 0x49)
    is_motorola = FALSE;
  else if (data[0] == 0x4D && data[1] == 0x4D)
    is_motorola = TRUE;
  else
    return;

  /* Check Tag Mark */
  if (is_motorola) {
    if (data[2] != 0) return;
    if (data[3] != 0x2A) return;
  } else {
    if (data[3] != 0) return;
    if (data[2] != 0x2A) return;
  }

  /* Get first IFD offset (offset to IFD0) */
  if (is_motorola) {
    if (data[4] != 0) return;
    if (data[5] != 0) return;
    firstoffset = data[6];
    firstoffset <<= 8;
    firstoffset += data[7];
  } else {
    if (data[7] != 0) return;
    if (data[6] != 0) return;
    firstoffset = data[5];
    firstoffset <<= 8;
    firstoffset += data[4];
  }
  if (firstoffset > length - 2) return; /* check end of data segment */

  /* Get the number of directory entries contained in this IFD */
  if (is_motorola) {
    number_of_tags = data[firstoffset];
    number_of_tags <<= 8;
    number_of_tags += data[firstoffset + 1];
  } else {
    number_of_tags = data[firstoffset + 1];
    number_of_tags <<= 8;
    number_of_tags += data[firstoffset];
  }
  if (number_of_tags == 0) return;
  firstoffset += 2;

  /* Search for ExifSubIFD offset Tag in IFD0 */
  for (;;) {
    if (firstoffset > length - 12) return; /* check end of data segment */
    /* Get Tag number */
    if (is_motorola) {
      tagnum = data[firstoffset];
      tagnum <<= 8;
      tagnum += data[firstoffset + 1];
    } else {
      tagnum = data[firstoffset + 1];
      tagnum <<= 8;
      tagnum += data[firstoffset];
    }
    if (tagnum == 0x8769) break; /* found ExifSubIFD offset Tag */
    if (--number_of_tags == 0) return;
    firstoffset += 12;
  }

  /* Get the ExifSubIFD offset */
  if (is_motorola) {
    if (data[firstoffset + 8] != 0) return;
    if (data[firstoffset + 9] != 0) return;
    offset = data[firstoffset + 10];
    offset <<= 8;
    offset += data[firstoffset + 11];
  } else {
    if (data[firstoffset + 11] != 0) return;
    if (data[firstoffset + 10] != 0) return;
    offset = data[firstoffset + 9];
    offset <<= 8;
    offset += data[firstoffset + 8];
  }
  if (offset > length - 2) return; /* check end of data segment */

  /* Get the number of directory entries contained in this SubIFD */
  if (is_motorola) {
    number_of_tags = data[offset];
    number_of_tags <<= 8;
    number_of_tags += data[offset + 1];
  } else {
    number_of_tags = data[offset + 1];
    number_of_tags <<= 8;
    number_of_tags += data[offset];
  }
  if (number_of_tags < 2) return;
  offset += 2;

  /* Search for ExifImageWidth and ExifImageHeight Tags in this SubIFD */
  do {
    if (offset > length - 12) return; /* check end of data segment */
    /* Get Tag number */
    if (is_motorola) {
      tagnum = data[offset];
      tagnum <<= 8;
      tagnum += data[offset + 1];
    } else {
      tagnum = data[offset + 1];
      tagnum <<= 8;
      tagnum += data[offset];
    }
    if (tagnum == 0xA002 || tagnum == 0xA003) {
      if (tagnum == 0xA002)
        new_value = new_width; /* ExifImageWidth Tag */
      else
        new_value = new_height; /* ExifImageHeight Tag */
      if (is_motorola) {
        data[offset + 2] = 0; /* Format = unsigned long (4 octets) */
        data[offset + 3] = 4;
        data[offset + 4] = 0; /* Number Of Components = 1 */
        data[offset + 5] = 0;
        data[offset + 6] = 0;
        data[offset + 7] = 1;
        data[offset + 8] = 0;
        data[offset + 9] = 0;
        data[offset + 10] = (JOCTET)((new_value >> 8) & 0xFF);
        data[offset + 11] = (JOCTET)(new_value & 0xFF);
      } else {
        data[offset + 2] = 4; /* Format = unsigned long (4 octets) */
        data[offset + 3] = 0;
        data[offset + 4] = 1; /* Number Of Components = 1 */
        data[offset + 5] = 0;
        data[offset + 6] = 0;
        data[offset + 7] = 0;
        data[offset + 8] = (JOCTET)(new_value & 0xFF);
        data[offset + 9] = (JOCTET)((new_value >> 8) & 0xFF);
        data[offset + 10] = 0;
        data[offset + 11] = 0;
      }
    }
    offset += 12;
  } while (--number_of_tags);
}